

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void sorter_heap_sort(int64_t *dst,size_t size)

{
  long lVar1;
  int64_t iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t child_1;
  size_t child;
  ulong uVar6;
  int64_t _sort_swap_temp;
  bool bVar7;
  
  if (1 < size) {
    uVar3 = size >> 1;
    uVar4 = uVar3;
LAB_0010cf5f:
    do {
      uVar6 = uVar3 * 2;
      if (uVar6 <= size - 1) {
        if ((uVar6 < size - 1) && (dst[uVar3 * 2] < dst[uVar3 * 2 + 1])) {
          uVar6 = uVar6 | 1;
        }
        lVar1 = dst[uVar3];
        if (lVar1 < dst[uVar6]) {
          dst[uVar3] = dst[uVar6];
          dst[uVar6] = lVar1;
          uVar3 = uVar6;
          goto LAB_0010cf5f;
        }
      }
      bVar7 = uVar4 != 0;
      uVar3 = uVar4 - 1;
      uVar4 = uVar3;
    } while (bVar7);
LAB_0010cfef:
    sVar5 = size - 1;
    if (sVar5 != 0) {
      iVar2 = dst[sVar5];
      dst[sVar5] = *dst;
      *dst = iVar2;
      uVar4 = size - 2;
      uVar3 = 0;
      while( true ) {
        uVar6 = uVar3 * 2;
        size = sVar5;
        if (uVar4 < uVar6) break;
        if ((uVar6 < uVar4) && (dst[uVar3 * 2] < dst[uVar3 * 2 + 1])) {
          uVar6 = uVar6 | 1;
        }
        lVar1 = dst[uVar3];
        if (dst[uVar6] <= lVar1) break;
        dst[uVar3] = dst[uVar6];
        dst[uVar6] = lVar1;
        uVar3 = uVar6;
      }
      goto LAB_0010cfef;
    }
  }
  return;
}

Assistant:

void HEAP_SORT(SORT_TYPE *dst, const size_t size) {
  size_t end = size - 1;

  /* don't bother sorting an array of size <= 1 */
  if (size <= 1) {
    return;
  }

  HEAPIFY(dst, size);

  while (end > 0) {
    SORT_SWAP(dst[end], dst[0]);
    HEAP_SIFT_DOWN(dst, 0, end - 1);
    end--;
  }
}